

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  int iVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  component_t l;
  color_quad<unsigned_char,_int> c;
  uint x;
  uint y;
  undefined1 in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  color_quad<unsigned_char,_int> local_14;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; local_c < in_RDI->m_height; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < in_RDI->m_width; local_10 = local_10 + 1) {
      pcVar2 = operator()(in_RDI,local_10,local_c);
      color_quad<unsigned_char,_int>::color_quad(&local_14,pcVar2);
      iVar1 = color_quad<unsigned_char,_int>::get_luma(&local_14);
      local_14.field_0.field_0.a = (uchar)iVar1;
      pcVar2 = operator()(in_RDI,local_10,local_c);
      color_quad<unsigned_char,_int>::operator=(pcVar2,&local_14);
    }
  }
  set_component_valid(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  return;
}

Assistant:

void set_alpha_to_luma() {
    for (uint y = 0; y < m_height; y++)
      for (uint x = 0; x < m_width; x++) {
        color_type c((*this)(x, y));
        typename color_type::component_t l = static_cast<typename color_type::component_t>(c.get_luma());
        c.a = l;
        (*this)(x, y) = c;
      }

    set_component_valid(3, true);
  }